

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::checkPoint(PeleLM *this,string *dir,ostream *os,How how,bool dump_old)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  ostream *poVar4;
  Real *pRVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  string tvfile;
  FArrayBox tvfab;
  ofstream tvos;
  size_type local_240 [3];
  int aiStack_228 [121];
  Box local_44;
  
  NavierStokesBase::checkPoint(&this->super_NavierStokesBase,dir,os,how,dump_old);
  if (((this->super_NavierStokesBase).super_AmrLevel.level == 0) &&
     (*(int *)(amrex::ParallelContext::frames + 0xc) == 0)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tvos,dir,
                   "/");
    std::operator+(&tvfile,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tvos,&typical_values_filename_abi_cxx11_);
    std::__cxx11::string::~string((string *)&tvos);
    std::ofstream::ofstream(&tvos);
    std::ofstream::open((char *)&tvos,(_Ios_Openmode)tvfile._M_dataplus._M_p);
    if (*(int *)((long)aiStack_228 + *(long *)(_tvos + -0x18)) != 0) {
      amrex::FileOpenFailed(&tvfile);
    }
    local_44.smallend.vect[0] = 0;
    local_44.smallend.vect[1] = 0;
    local_44.bigend.vect._0_8_ = ZEXT48(NavierStokesBase::NUM_STATE - 1);
    local_44.smallend.vect[2] = 0;
    local_44.bigend.vect[2] = 0;
    local_44.btype.itype = 0;
    uVar8 = (ulong)((long)typical_values.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)typical_values.super_vector<double,_std::allocator<double>_>.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
    uVar6 = 0;
    iVar7 = (int)uVar8;
    amrex::FArrayBox::FArrayBox(&tvfab,&local_44,iVar7,true,false,(Arena *)0x0);
    uVar8 = uVar8 & 0xffffffff;
    if (iVar7 < 1) {
      uVar8 = uVar6;
    }
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      dVar1 = typical_values.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar6];
      pdVar2 = amrex::BaseFab<double>::dataPtr(&tvfab.super_BaseFab<double>,0);
      pdVar2[uVar6] = dVar1;
    }
    amrex::FArrayBox::writeOn(&tvfab,(ostream *)&tvos);
    amrex::BaseFab<double>::~BaseFab(&tvfab.super_BaseFab<double>);
    std::ofstream::~ofstream(&tvos);
    std::__cxx11::string::~string((string *)&tvfile);
  }
  if (closed_chamber != 0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&tvfile,0x200000,(allocator_type *)&tvos);
    if (*(int *)(amrex::ParallelContext::frames + 0xc) == 0) {
      std::ofstream::ofstream(&tvos);
      (**(code **)(local_240[0] + 0x18))
                (local_240,tvfile._M_dataplus._M_p,
                 tvfile._M_string_length - (long)tvfile._M_dataplus._M_p);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tvfab,dir
                     ,"/PAMB");
      std::ofstream::open((char *)&tvos,(_Ios_Openmode)tvfab.super_BaseFab<double>._vptr_BaseFab);
      lVar3 = *(long *)(_tvos + -0x18);
      if (*(int *)((long)aiStack_228 + lVar3) != 0) {
        amrex::FileOpenFailed((string *)&tvfab);
        lVar3 = *(long *)(_tvos + -0x18);
      }
      *(undefined8 *)((long)local_240 + lVar3) = 0x11;
      iVar7 = *(((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
               super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::operator<<((ostream *)&tvos,"Writing p_amb to checkpoint\n");
      pRVar5 = &p_amb_new;
      if (iVar7 == 0) {
        pRVar5 = &p_amb_old;
      }
      poVar4 = std::ostream::_M_insert<double>(*pRVar5);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&tvfab);
      std::ofstream::~ofstream(&tvos);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&tvfile);
  }
  return;
}

Assistant:

void
PeleLM::checkPoint (const std::string& dir,
                    std::ostream&      os,
                    VisMF::How         how,
                    bool               dump_old)
{
  NavierStokesBase::checkPoint(dir,os,how,dump_old);

  if (level == 0)
  {
    if (ParallelDescriptor::IOProcessor())
    {
      const std::string tvfile = dir + "/" + typical_values_filename;
      std::ofstream tvos;
      tvos.open(tvfile.c_str(),std::ios::out|std::ios::trunc|std::ios::binary);
      if (!tvos.good())
        amrex::FileOpenFailed(tvfile);
      Box tvbox(IntVect(),(NUM_STATE-1)*amrex::BASISV(0));
      int nComp = typical_values.size();
      FArrayBox tvfab(tvbox,nComp);
      for (int i=0; i<nComp; ++i) {
        tvfab.dataPtr()[i] = typical_values[i];
      }
      tvfab.writeOn(tvos);
    }
  }

  if (closed_chamber) {

      VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);

      if (ParallelDescriptor::IOProcessor()) {

          std::ofstream PAMBFile;
          PAMBFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
          std::string PAMBFileName(dir + "/PAMB");
          PAMBFile.open(PAMBFileName.c_str(), std::ofstream::out   |
                        std::ofstream::trunc |
                        std::ofstream::binary);

          if( !PAMBFile.good()) {
              amrex::FileOpenFailed(PAMBFileName);
          }

          PAMBFile.precision(17);

          int step = parent->levelSteps(0);

          // write out title line
          PAMBFile << "Writing p_amb to checkpoint\n";
          if (step == 0) {
              PAMBFile << p_amb_old << "\n";
          }
          else {
              PAMBFile << p_amb_new << "\n";
          }
      }
  }
}